

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O2

void __thiscall DIS::DetonationPdu::~DetonationPdu(DetonationPdu *this)

{
  (this->super_WarfareFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__DetonationPdu_001c10c0;
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::clear
            (&this->_variableParameters);
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::~vector
            (&this->_variableParameters);
  Vector3Float::~Vector3Float(&this->_locationOfEntityCoordinates);
  MunitionDescriptor::~MunitionDescriptor(&this->_descriptor);
  Vector3Double::~Vector3Double(&this->_locationInWorldCoordinates);
  Vector3Float::~Vector3Float(&this->_velocity);
  EventIdentifier::~EventIdentifier(&this->_eventID);
  EntityID::~EntityID(&this->_explodingEntityID);
  WarfareFamilyPdu::~WarfareFamilyPdu(&this->super_WarfareFamilyPdu);
  return;
}

Assistant:

DetonationPdu::~DetonationPdu()
{
    _variableParameters.clear();
}